

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkTreePage(IntegrityCk *pCheck,int iPage,char *zParentContext,i64 *pnParentMinKey,
                 i64 *pnParentMaxKey)

{
  byte bVar1;
  BtShared *pBt;
  u8 *puVar2;
  long lVar3;
  i64 iVar4;
  ushort uVar5;
  u16 uVar6;
  int iVar7;
  uint uVar8;
  void *__s;
  char *pcVar9;
  int iVar10;
  DbPage *pPg;
  i64 *piVar11;
  u32 uVar12;
  ulong uVar13;
  long *plVar14;
  uint uVar15;
  uint *pCell;
  i64 nMaxKey;
  i64 nMinKey;
  MemPage *pPage;
  CellInfo info;
  char zContext [100];
  i64 local_f8;
  long *local_f0;
  ulong local_e8;
  ulong local_e0;
  long *local_d8;
  i64 local_d0;
  uint local_c8;
  uint local_c4;
  MemPage *local_c0;
  CellInfo local_b8;
  char local_98 [104];
  
  local_d0 = 0;
  local_f8 = 0;
  sqlite3_snprintf(100,local_98,"Page %d: ");
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  uVar15 = pBt->usableSize;
  local_f0 = pnParentMaxKey;
  local_d8 = pnParentMinKey;
  iVar7 = checkRef(pCheck,iPage,zParentContext);
  if (iVar7 != 0) {
    return 0;
  }
  uVar8 = btreeGetPage(pBt,iPage,&local_c0,0,0);
  if (uVar8 != 0) {
    checkAppendMsg(pCheck,local_98,"unable to get the page. error code=%d",(ulong)uVar8);
    return 0;
  }
  local_c0->isInit = '\0';
  uVar8 = btreeInitPage(local_c0);
  if (uVar8 != 0) {
    iVar7 = 0;
    checkAppendMsg(pCheck,local_98,"btreeInitPage() returns error code %d",(ulong)uVar8);
    pPg = local_c0->pDbPage;
    goto LAB_00146a5d;
  }
  local_e8 = (ulong)uVar15;
  if (local_c0->nCell == 0) {
    iVar7 = 1;
  }
  else {
    local_e0 = CONCAT44(local_e0._4_4_,uVar15 - 5);
    local_c4 = uVar15 - 4;
    uVar13 = 0;
    iVar7 = 0;
    do {
      if (pCheck->mxErr == 0) break;
      sqlite3_snprintf(100,local_98,"On tree page %d cell %d: ",iPage,uVar13 & 0xffffffff);
      pCell = (uint *)(local_c0->aData +
                      (CONCAT11(local_c0->aCellIdx[uVar13 * 2],local_c0->aCellIdx[uVar13 * 2 + 1]) &
                      local_c0->maskPage));
      btreeParseCellPtr(local_c0,(u8 *)pCell,&local_b8);
      uVar12 = local_b8.nData;
      if (local_c0->intKey == '\0') {
        uVar12 = local_b8.nData + (int)local_b8.nKey;
        lVar3 = local_f8;
        iVar4 = local_d0;
      }
      else {
        lVar3 = CONCAT44(local_b8.nKey._4_4_,(int)local_b8.nKey);
        iVar4 = lVar3;
        if ((uVar13 != 0) && (iVar4 = local_d0, lVar3 <= local_f8)) {
          checkAppendMsg(pCheck,local_98,"Rowid %lld out of order (previous was %lld)",lVar3);
          iVar4 = local_d0;
        }
      }
      local_d0 = iVar4;
      local_f8 = lVar3;
      if ((local_b8.nLocal < uVar12) &&
         ((uint *)((ulong)local_b8.iOverflow + (long)pCell) <= local_c0->aData + pBt->usableSize)) {
        uVar8 = ((uVar12 + (int)local_e0) - (uint)local_b8.nLocal) / local_c4;
        uVar15 = *(uint *)((ulong)local_b8.iOverflow + (long)pCell);
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        if (pBt->autoVacuum != '\0') {
          local_c8 = uVar8;
          checkPtrmap(pCheck,uVar15,'\x03',iPage,local_98);
          uVar8 = local_c8;
        }
        checkList(pCheck,0,uVar15,uVar8,local_98);
      }
      iVar10 = iVar7;
      if (local_c0->leaf == '\0') {
        uVar15 = *pCell;
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        if (pBt->autoVacuum != '\0') {
          checkPtrmap(pCheck,uVar15,'\x05',iPage,local_98);
        }
        piVar11 = &local_f8;
        if (uVar13 == 0) {
          piVar11 = (i64 *)0x0;
        }
        iVar10 = checkTreePage(pCheck,uVar15,local_98,&local_d0,piVar11);
        if ((uVar13 != 0) && (iVar10 != iVar7)) {
          checkAppendMsg(pCheck,local_98,"Child page depth differs");
        }
      }
      iVar7 = iVar10;
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_c0->nCell);
    iVar7 = iVar7 + 1;
    uVar15 = (uint)local_e8;
  }
  if (local_c0->leaf == '\0') {
    uVar8 = *(uint *)(local_c0->aData + (ulong)local_c0->hdrOffset + 8);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    sqlite3_snprintf(100,local_98,"On page %d at right child: ");
    if (pBt->autoVacuum != '\0') {
      checkPtrmap(pCheck,uVar8,'\x05',iPage,local_98);
    }
    piVar11 = &local_f8;
    if (local_c0->nCell == 0) {
      piVar11 = (i64 *)0x0;
    }
    checkTreePage(pCheck,uVar8,local_98,(i64 *)0x0,piVar11);
    if (local_c0->leaf != '\0') goto LAB_0014676a;
  }
  else {
LAB_0014676a:
    if (local_c0->intKey != '\0') {
      if (local_d8 == (long *)0x0) {
        if ((local_f0 != (long *)0x0) && (local_d0 <= *local_f0)) {
          pcVar9 = "Rowid %lld out of order (min less than parent max of %lld)";
LAB_0014682a:
          checkAppendMsg(pCheck,local_98,pcVar9);
        }
      }
      else if (local_f0 == (long *)0x0) {
        if (*local_d8 < local_f8) {
          pcVar9 = "Rowid %lld out of order (max larger than parent min of %lld)";
          goto LAB_0014682a;
        }
      }
      else {
        if (local_d0 <= *local_d8) {
          checkAppendMsg(pCheck,local_98,
                         "Rowid %lld out of order (min less than parent min of %lld)");
        }
        if (*local_f0 < local_f8) {
          checkAppendMsg(pCheck,local_98,
                         "Rowid %lld out of order (max larger than parent max of %lld)");
        }
        *local_d8 = local_f8;
      }
    }
  }
  puVar2 = local_c0->aData;
  uVar13 = (ulong)local_c0->hdrOffset;
  __s = pcache1Alloc(pBt->pageSize);
  if (__s == (void *)0x0) {
    pCheck->mallocFailed = 1;
  }
  else {
    uVar8 = ((uint)puVar2[uVar13 + 5] * 0x100 + (uint)puVar2[uVar13 + 6]) - 1 & 0xffff;
    memset((void *)((long)__s + (ulong)uVar8 + 1),0,(long)(int)(~uVar8 + uVar15));
    memset(__s,1,(ulong)uVar8 + 1);
    uVar5 = *(ushort *)(puVar2 + uVar13 + 3) << 8 | *(ushort *)(puVar2 + uVar13 + 3) >> 8;
    local_e0 = uVar13;
    if (uVar5 != 0) {
      bVar1 = local_c0->leaf;
      local_f0 = (long *)CONCAT44(local_f0._4_4_,(int)local_e8 + -4);
      local_d8 = (long *)(ulong)uVar5;
      plVar14 = (long *)0x0;
      do {
        uVar5 = *(ushort *)(puVar2 + (long)plVar14 * 2 + uVar13 + (ulong)bVar1 * -4 + 0xc) << 8 |
                *(ushort *)(puVar2 + (long)plVar14 * 2 + uVar13 + (ulong)bVar1 * -4 + 0xc) >> 8;
        if ((int)local_f0 < (int)(uint)uVar5) {
          iVar10 = uVar5 + 0x10000;
          if ((int)local_e8 < iVar10) {
LAB_00146930:
            checkAppendMsg(pCheck,(char *)0x0,"Corruption detected in cell %d on page %d",
                           (ulong)plVar14 & 0xffffffff,iPage);
          }
          else {
LAB_00146952:
            pcVar9 = (char *)((ulong)(iVar10 - 1) + (long)__s);
            do {
              *pcVar9 = *pcVar9 + '\x01';
              iVar10 = iVar10 + -1;
              pcVar9 = pcVar9 + -1;
            } while ((int)(uint)uVar5 < iVar10);
          }
        }
        else {
          uVar6 = cellSizePtr(local_c0,puVar2 + uVar5);
          iVar10 = (uint)uVar6 + (uint)uVar5;
          if ((int)local_e8 < iVar10) goto LAB_00146930;
          if (uVar6 != 0) goto LAB_00146952;
        }
        plVar14 = (long *)((long)plVar14 + 1);
      } while (plVar14 != local_d8);
    }
    uVar5 = *(ushort *)(puVar2 + local_e0 + 1) << 8 | *(ushort *)(puVar2 + local_e0 + 1) >> 8;
    while (uVar5 != 0) {
      uVar15 = (uint)uVar5;
      uVar8 = (uint)CONCAT11(puVar2[(ulong)uVar15 + 2],puVar2[(ulong)uVar15 + 3]);
      if (uVar8 != 0) {
        iVar10 = uVar8 + uVar15;
        pcVar9 = (char *)((ulong)(((uint)puVar2[(ulong)uVar15 + 2] * 0x100 + uVar15 +
                                  (uint)puVar2[(ulong)uVar15 + 3]) - 1) + (long)__s);
        do {
          *pcVar9 = *pcVar9 + '\x01';
          iVar10 = iVar10 + -1;
          pcVar9 = pcVar9 + -1;
        } while ((int)uVar15 < iVar10);
      }
      uVar5 = *(ushort *)(puVar2 + uVar15) << 8 | *(ushort *)(puVar2 + uVar15) >> 8;
    }
    if ((int)local_e8 < 1) {
      uVar15 = 0;
    }
    else {
      uVar13 = 0;
      uVar15 = 0;
      do {
        if (*(char *)((long)__s + uVar13) == '\0') {
          uVar15 = uVar15 + 1;
        }
        else if ('\x01' < *(char *)((long)__s + uVar13)) {
          checkAppendMsg(pCheck,(char *)0x0,"Multiple uses for byte %d of page %d",uVar13,iPage);
          break;
        }
        uVar13 = uVar13 + 1;
      } while (local_e8 != uVar13);
    }
    if (uVar15 != puVar2[local_e0 + 7]) {
      checkAppendMsg(pCheck,(char *)0x0,"Fragmentation of %d bytes reported as %d on page %d",
                     (ulong)uVar15,(ulong)puVar2[local_e0 + 7],iPage);
    }
    pcache1Free(__s);
  }
  pPg = local_c0->pDbPage;
LAB_00146a5d:
  sqlite3PagerUnref(pPg);
  return iVar7;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  char *zParentContext, /* Parent context */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char zContext[100];
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;

  sqlite3_snprintf(sizeof(zContext), zContext, "Page %d: ", iPage);

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage, zParentContext) ) return 0;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0, 0))!=0 ){
    checkAppendMsg(pCheck, zContext,
       "unable to get the page. error code=%d", rc);
    return 0;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck, zContext, 
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    return 0;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    sqlite3_snprintf(sizeof(zContext), zContext,
             "On tree page %d cell %d: ", iPage, i);
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nData;
    if( !pPage->intKey ) sz += (int)info.nKey;
    /* For intKey pages, check that the keys are in order.
    */
    else if( i==0 ) nMinKey = nMaxKey = info.nKey;
    else{
      if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    assert( sz==info.nPayload );
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage, zContext);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage, zContext);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, zContext, &nMinKey, i==0 ? NULL : &nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, zContext, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    sqlite3_snprintf(sizeof(zContext), zContext, 
                     "On page %d at right child: ", iPage);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
    }
#endif
    checkTreePage(pCheck, pgno, zContext, NULL, !pPage->nCell ? NULL : &nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    nCell = get2byte(&data[hdr+3]);
    cellStart = hdr + 12 - 4*pPage->leaf;
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        checkAppendMsg(pCheck, 0, 
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      j = get2byte(&data[i]);
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck, 0,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck, 0, 
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);
  return depth+1;
}